

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::GoogleTestFailureException::GoogleTestFailureException
          (GoogleTestFailureException *this,TestPartResult *failure)

{
  TestPartResult *in_RDX;
  string local_38;
  
  PrintTestPartResultToString_abi_cxx11_(&local_38,(internal *)failure,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_00204b28;
  return;
}

Assistant:

GoogleTestFailureException::GoogleTestFailureException(
    const TestPartResult& failure)
    : ::std::runtime_error(PrintTestPartResultToString(failure).c_str()) {}